

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixCheckReservedLock(unqlite_file *id,int *pResOut)

{
  int iVar1;
  int *piVar2;
  short local_48 [2];
  int tErrno;
  flock lock;
  unixFile *pFile;
  int reserved;
  int rc;
  int *pResOut_local;
  unqlite_file *id_local;
  
  pFile._4_4_ = 0;
  lock._24_8_ = id;
  unixEnterMutex();
  pFile._0_4_ = (uint)(1 < *(int *)(*(long *)(lock._24_8_ + 8) + 0x14));
  if ((uint)pFile == 0) {
    local_48[1] = 0;
    lock.l_type = 1;
    lock.l_whence = 0x4000;
    lock._4_4_ = 0;
    lock.l_start = 1;
    local_48[0] = 1;
    iVar1 = fcntl(*(int *)(lock._24_8_ + 0x10),5,local_48);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      pFile._4_4_ = unqliteErrorFromPosixError(iVar1,-0x4c);
      *(int *)(lock._24_8_ + 0x1c) = iVar1;
    }
    else if (local_48[0] != 2) {
      pFile._0_4_ = 1;
    }
  }
  unixLeaveMutex();
  *pResOut = (uint)pFile;
  return pFile._4_4_;
}

Assistant:

static int unixCheckReservedLock(unqlite_file *id, int *pResOut){
  int rc = UNQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

 
  unixEnterMutex(); /* Because pFile->pInode is shared across threads */

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
  if( !reserved ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if (-1 == fcntl(pFile->h, F_GETLK, &lock)) {
      int tErrno = errno;
	  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
      pFile->lastErrno = tErrno;
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
  
  unixLeaveMutex();
 
  *pResOut = reserved;
  return rc;
}